

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall chrono::ChMatterSPH::SetNoSpeedNoAcceleration(ChMatterSPH *this)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  
  dVar6 = DAT_011dd3e8;
  dVar5 = DAT_011dd3e0;
  uVar4 = VNULL;
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar7 = 0; (ulong)uVar7 < (ulong)((long)psVar2 - (long)psVar1 >> 4); uVar7 = uVar7 + 1) {
    peVar3 = psVar1[uVar7].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x11dd3b8) {
      ((ChVector<double> *)((long)&peVar3->super_ChNodeXYZ + 0x20))->m_data[0] = (double)uVar4;
      *(double *)((long)&peVar3->super_ChNodeXYZ + 0x28) = dVar5;
      *(double *)((long)&peVar3->super_ChNodeXYZ + 0x30) = dVar6;
    }
    if (peVar3 != (element_type *)0x11dd3a0) {
      ((ChVector<double> *)((long)&peVar3->super_ChNodeXYZ + 0x38))->m_data[0] = (double)uVar4;
      *(double *)((long)&peVar3->super_ChNodeXYZ + 0x40) = dVar5;
      *(double *)((long)&peVar3->super_ChNodeXYZ + 0x48) = dVar6;
    }
  }
  return;
}

Assistant:

void ChMatterSPH::SetNoSpeedNoAcceleration() {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->SetPos_dt(VNULL);
        nodes[j]->SetPos_dtdt(VNULL);
    }
}